

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmRuntimeDependencyArchive.cxx
# Opt level: O1

bool __thiscall
cmRuntimeDependencyArchive::IsPreExcluded(cmRuntimeDependencyArchive *this,string *name)

{
  pointer pcVar1;
  bool bVar2;
  anon_class_8_1_60cb577c regexSearch;
  anon_class_40_2_f7e7401d_for__M_pred regexMatch;
  RegularExpressionMatch match;
  anon_class_8_1_60cb577c local_250;
  undefined1 local_248 [8];
  long *local_240;
  long local_230 [2];
  undefined1 local_220 [520];
  
  memset(local_220,0,0x208);
  pcVar1 = (name->_M_dataplus)._M_p;
  local_248 = (undefined1  [8])local_220;
  local_240 = local_230;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_240,pcVar1,pcVar1 + name->_M_string_length);
  local_250.regexMatch = (anon_class_40_2_f7e7401d_for__M_pred *)local_248;
  bVar2 = IsPreExcluded::anon_class_8_1_60cb577c::operator()(&local_250,&this->PreIncludeRegexes);
  if (bVar2) {
    bVar2 = false;
  }
  else {
    bVar2 = IsPreExcluded::anon_class_8_1_60cb577c::operator()(&local_250,&this->PreExcludeRegexes);
  }
  if (local_240 != local_230) {
    operator_delete(local_240,local_230[0] + 1);
  }
  return bVar2;
}

Assistant:

bool cmRuntimeDependencyArchive::IsPreExcluded(const std::string& name) const
{
  cmsys::RegularExpressionMatch match;
  auto const regexMatch =
    [&match, name](const cmsys::RegularExpression& regex) -> bool {
    return regex.find(name.c_str(), match);
  };
  auto const regexSearch =
    [&regexMatch](
      const std::vector<cmsys::RegularExpression>& regexes) -> bool {
    return std::any_of(regexes.begin(), regexes.end(), regexMatch);
  };

  return !regexSearch(this->PreIncludeRegexes) &&
    regexSearch(this->PreExcludeRegexes);
}